

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlayStack.cpp
# Opt level: O3

ILayoutPtr __thiscall cursespp::OverlayStack::Top(OverlayStack *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  ILayoutPtr IVar3;
  ILayoutPtr IVar4;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->stack).
           super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&none;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (this->stack).
      super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var1) {
    _Var2._M_pi = p_Var1;
  }
  (in_RDI->super_IWindowGroup)._vptr_IWindowGroup =
       (_func_int **)
       ((__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> *)
       &(_Var2._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var2._M_pi)->_M_use_count)->_M_pi;
  (in_RDI->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      IVar3.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      IVar3.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (ILayoutPtr)IVar3.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  IVar4.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  IVar4.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ILayoutPtr)IVar4.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ILayoutPtr OverlayStack::Top() {
    return this->stack.size() ? this->stack[0] : none;
}